

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_HasProperty(JSContext *ctx,JSValue obj,JSAtom prop)

{
  JSClassExoticMethods *pJVar1;
  _func_int_JSContext_ptr_JSValue_JSAtom *p_Var2;
  int iVar3;
  int iVar4;
  JSRefCountHeader *p;
  JSValueUnion p_00;
  JSValue v;
  JSValue JVar5;
  JSValue v_00;
  
  p_00 = obj.u;
  if ((int)obj.tag == -1) {
    do {
      if ((((*(byte *)((long)p_00.ptr + 5) & 4) != 0) &&
          (pJVar1 = ctx->rt->class_array[*(ushort *)((long)p_00.ptr + 6)].exotic,
          pJVar1 != (JSClassExoticMethods *)0x0)) &&
         (p_Var2 = pJVar1->has_property, p_Var2 != (_func_int_JSContext_ptr_JSValue_JSAtom *)0x0)) {
        *(int *)p_00.ptr = *p_00.ptr + 1;
        JVar5.tag = -1;
        JVar5.u.ptr = p_00.ptr;
        iVar3 = (*p_Var2)(ctx,JVar5,prop);
        iVar4 = *p_00.ptr;
        *(int *)p_00.ptr = iVar4 + -1;
        if (1 < iVar4) {
          return iVar3;
        }
        v_00.tag = -1;
        v_00.u.ptr = p_00.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
        return iVar3;
      }
      *(int *)p_00.ptr = *p_00.ptr + 1;
      iVar3 = JS_GetOwnPropertyInternal(ctx,(JSPropertyDescriptor *)0x0,(JSObject *)p_00.ptr,prop);
      iVar4 = *p_00.ptr;
      *(int *)p_00.ptr = iVar4 + -1;
      if (iVar4 < 2) {
        v.tag = -1;
        v.u.ptr = p_00.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      if (iVar3 != 0) {
        return iVar3;
      }
      if (((ushort)(*(short *)((long)p_00.ptr + 6) - 0x15U) < 9) &&
         (iVar4 = JS_AtomIsNumericIndex(ctx,prop), iVar4 != 0)) {
        return iVar4 >> 0x1f;
      }
      p_00 = (JSValueUnion)(*(JSShape **)((long)p_00.ptr + 0x18))->proto;
    } while ((JSObject *)p_00.ptr != (JSObject *)0x0);
  }
  return 0;
}

Assistant:

int JS_HasProperty(JSContext *ctx, JSValueConst obj, JSAtom prop)
{
    JSObject *p;
    int ret;
    JSValue obj1;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    for(;;) {
        if (p->is_exotic) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->has_property) {
                /* has_property can free the prototype */
                obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                ret = em->has_property(ctx, obj1, prop);
                JS_FreeValue(ctx, obj1);
                return ret;
            }
        }
        /* JS_GetOwnPropertyInternal can free the prototype */
        JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        ret = JS_GetOwnPropertyInternal(ctx, NULL, p, prop);
        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        if (ret != 0)
            return ret;
        if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
            p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return FALSE;
            }
        }
        p = p->shape->proto;
        if (!p)
            break;
    }
    return FALSE;
}